

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O1

VariableData * FindGlobalAt(ExpressionContext *exprCtx,uint offset)

{
  TypeBase **ppTVar1;
  VariableData *pVVar2;
  long lVar3;
  VariableData *in_RAX;
  ulong uVar4;
  ScopeData *pSVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  
  uVar4 = (ulong)(exprCtx->variables).count;
  if (uVar4 == 0) {
    return (VariableData *)0x0;
  }
  uVar6 = 0;
  do {
    pVVar2 = (exprCtx->variables).data[uVar6];
    uVar7 = 0;
    if (pVVar2->importModule != (ModuleData *)0x0) {
      uVar7 = pVVar2->importModule->importIndex;
    }
    pSVar5 = pVVar2->scope;
    if ((pSVar5 != (ScopeData *)0x0) && (pSVar5->type != SCOPE_TEMPORARY)) {
      do {
        bVar8 = pSVar5->scope == (ScopeData *)0x0;
        if (bVar8) goto LAB_0029565a;
      } while ((pSVar5->ownerFunction == (FunctionData *)0x0) &&
              (ppTVar1 = &pSVar5->ownerType, pSVar5 = pSVar5->scope, *ppTVar1 == (TypeBase *)0x0));
    }
    bVar8 = false;
LAB_0029565a:
    if ((((bVar8) && (uVar7 == offset >> 0x18)) && (pVVar2->offset <= (offset & 0xffffff))) &&
       (lVar3 = pVVar2->type->size,
       lVar3 == 0 || (long)(ulong)(offset & 0xffffff) < (long)((ulong)pVVar2->offset + lVar3))) {
      bVar8 = false;
      in_RAX = pVVar2;
    }
    else {
      bVar8 = true;
    }
    if (!bVar8) {
      return in_RAX;
    }
    uVar6 = uVar6 + 1;
    if (uVar6 == uVar4) {
      return (VariableData *)0x0;
    }
  } while( true );
}

Assistant:

VariableData* FindGlobalAt(ExpressionContext &exprCtx, unsigned offset)
{
	unsigned targetModuleIndex = offset >> 24;

	if(targetModuleIndex)
		offset = offset & 0xffffff;

	for(unsigned i = 0; i < exprCtx.variables.size(); i++)
	{
		VariableData *variable = exprCtx.variables[i];

		unsigned variableModuleIndex = variable->importModule ? variable->importModule->importIndex : 0;

		if(IsGlobalScope(variable->scope) && variableModuleIndex == targetModuleIndex && offset >= variable->offset && (offset < variable->offset + variable->type->size || variable->type->size == 0))
			return variable;
	}

	return NULL;
}